

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O0

TestStatus *
vkt::clipping::anon_unknown_0::ClipDistanceComplementarity::testComplementarity
          (TestStatus *__return_storage_ptr__,Context *context,int numClipDistances)

{
  int iVar1;
  InstanceInterface *vki_00;
  ProgramCollection<vk::ProgramBinary> *pPVar2;
  ProgramBinary *pPVar3;
  size_type sVar4;
  reference pvVar5;
  TestContext *this;
  MessageBuilder *pMVar6;
  TestLog *pTVar7;
  float fVar8;
  float local_914;
  allocator<char> local_8b9;
  string local_8b8;
  byte local_893;
  byte local_892;
  allocator<char> local_891;
  string local_890;
  undefined4 local_86c;
  int numExpectedPixels;
  Vector<float,_4> local_858;
  ConstPixelBufferAccess local_848;
  int local_81c;
  undefined1 local_818 [4];
  int numGrayPixels;
  VulkanDrawContext drawContext;
  VulkanProgram vulkanProgram;
  DrawCallData drawCallData;
  DrawState drawState;
  MessageBuilder local_478;
  MessageBuilder local_2f8;
  TestLog *local_178;
  TestLog *log;
  Vec4 p3;
  Vec4 p2;
  Vec4 p1;
  Vec4 p0;
  float x;
  int ndxBase;
  int i_1;
  float dx;
  float sign;
  int setNdx;
  int i;
  vector<float,_std::allocator<float>_> clipDistances;
  int numVerticesPerSection;
  int numSections;
  Random rnd;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  string local_c0;
  Shader local_a0 [2];
  allocator<char> local_79;
  string local_78;
  Shader local_58;
  undefined1 local_48 [8];
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> shaders;
  VkPhysicalDevice physDevice;
  InstanceInterface *vki;
  Context *pCStack_18;
  int numClipDistances_local;
  Context *context_local;
  
  vki._4_4_ = numClipDistances;
  pCStack_18 = context;
  context_local = (Context *)__return_storage_ptr__;
  vki_00 = Context::getInstanceInterface(context);
  shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)Context::getPhysicalDevice(pCStack_18);
  requireFeatures(vki_00,(VkPhysicalDevice)
                         shaders.
                         super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0x200);
  std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::vector
            ((vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)local_48);
  pPVar2 = Context::getBinaryCollection(pCStack_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"vert",&local_79);
  pPVar3 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,&local_78);
  drawutil::Shader::Shader(&local_58,VK_SHADER_STAGE_VERTEX_BIT,pPVar3);
  std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::push_back
            ((vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)local_48,
             &local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  pPVar2 = Context::getBinaryCollection(pCStack_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"frag",
             (allocator<char> *)
             ((long)&vertices.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pPVar3 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,&local_c0);
  drawutil::Shader::Shader(local_a0,VK_SHADER_STAGE_FRAGMENT_BIT,pPVar3);
  std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::push_back
            ((vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)local_48,
             local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&vertices.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&rnd.m_rnd.z)
  ;
  de::Random::Random((Random *)&numVerticesPerSection,0x4d2);
  clipDistances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x10;
  clipDistances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 4;
  std::allocator<float>::allocator((allocator<float> *)((long)&setNdx + 3));
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&i,0x40,
             (allocator<float> *)((long)&setNdx + 3));
  std::allocator<float>::~allocator((allocator<float> *)((long)&setNdx + 3));
  for (sign = 0.0;
      sVar4 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)&i), (int)sign < (int)sVar4;
      sign = (float)((int)sign + 1)) {
    fVar8 = de::Random::getFloat((Random *)&numVerticesPerSection,-1.0,1.0);
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&i,(long)(int)sign);
    *pvVar5 = fVar8;
  }
  for (dx = 0.0; (int)dx < 2; dx = (float)((int)dx + 1)) {
    local_914 = 1.0;
    if (dx != 0.0) {
      local_914 = -1.0;
    }
    for (x = 0.0; (int)x < 0x10; x = (float)((int)x + 1)) {
      iVar1 = (int)x * 4;
      fVar8 = (float)(int)x * 0.125 + -1.0;
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&i,(long)iVar1);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(p1.m_data + 2),fVar8,-1.0,0.0,local_914 * *pvVar5);
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&i,(long)(iVar1 + 1));
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(p2.m_data + 2),fVar8,1.0,0.0,local_914 * *pvVar5);
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&i,(long)(iVar1 + 2));
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(p3.m_data + 2),fVar8 + 0.125,1.0,0.0,local_914 * *pvVar5);
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&i,(long)(iVar1 + 3));
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)&log,fVar8 + 0.125,-1.0,0.0,local_914 * *pvVar5);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &rnd.m_rnd.z,(value_type *)(p1.m_data + 2));
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &rnd.m_rnd.z,(value_type *)(p2.m_data + 2));
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &rnd.m_rnd.z,(value_type *)(p3.m_data + 2));
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &rnd.m_rnd.z,(value_type *)(p3.m_data + 2));
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &rnd.m_rnd.z,(value_type *)&log);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &rnd.m_rnd.z,(value_type *)(p1.m_data + 2));
    }
  }
  std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)&i);
  de::Random::~Random((Random *)&numVerticesPerSection);
  this = Context::getTestContext(pCStack_18);
  local_178 = tcu::TestContext::getLog(this);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&drawState.lineWidth,local_178,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&drawState.lineWidth,
                      (char (*) [82])
                      "Draw two sets of primitives with blending, differing only with ClipDistance sign."
                     );
  pTVar7 = tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::operator<<(&local_478,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_478,(char (*) [7])"Using ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)((long)&vki + 4));
  pMVar6 = tcu::MessageBuilder::operator<<
                     (pMVar6,(char (*) [65])
                             " clipping plane(s), one of them possibly having negative values.");
  pTVar7 = tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::operator<<(&local_2f8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_2f8,
                      (char (*) [81])
                      "Expecting a uniform gray area, no missing (black) nor overlapped (white) pixels."
                     );
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_2f8);
  tcu::MessageBuilder::~MessageBuilder(&local_478);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&drawState.lineWidth);
  drawutil::DrawState::DrawState
            ((DrawState *)((long)&drawCallData.vertices + 4),VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,
             0x80,0x80);
  drawutil::DrawCallData::DrawCallData
            ((DrawCallData *)&vulkanProgram,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&rnd.m_rnd.z)
  ;
  drawutil::VulkanProgram::VulkanProgram
            ((VulkanProgram *)
             &drawContext.m_vertexBuffer.
              super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>.
              m_data.field_0x8,
             (vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)local_48);
  drawState.renderSize.m_data[0]._1_1_ = 1;
  drawutil::VulkanDrawContext::VulkanDrawContext
            ((VulkanDrawContext *)local_818,pCStack_18,
             (DrawState *)((long)&drawCallData.vertices + 4),(DrawCallData *)&vulkanProgram,
             (VulkanProgram *)
             &drawContext.m_vertexBuffer.
              super_UniqueBase<vk::BufferWithMemory,_de::DefaultDeleter<vk::BufferWithMemory>_>.
              m_data.field_0x8);
  drawutil::VulkanDrawContext::draw((VulkanDrawContext *)local_818);
  drawutil::VulkanDrawContext::getColorPixels(&local_848,(VulkanDrawContext *)local_818);
  tcu::Vector<float,_4>::Vector(&local_858,0.5,0.5,0.5,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xfffffffffffff798,0.02,0.02,0.02,0.0);
  local_81c = countPixels(&local_848,&local_858,(Vec4 *)&stack0xfffffffffffff798);
  local_86c = 0x4000;
  local_892 = 0;
  local_893 = 0;
  if (local_81c == 0x4000) {
    std::allocator<char>::allocator();
    local_892 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_890,"OK",&local_891);
    local_893 = 1;
    tcu::TestStatus::pass(__return_storage_ptr__,&local_890);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8b8,"Rendered image(s) are incorrect",&local_8b9);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_8b8);
    std::__cxx11::string::~string((string *)&local_8b8);
    std::allocator<char>::~allocator(&local_8b9);
  }
  if ((local_893 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_890);
  }
  if ((local_892 & 1) != 0) {
    std::allocator<char>::~allocator(&local_891);
  }
  drawutil::VulkanDrawContext::~VulkanDrawContext((VulkanDrawContext *)local_818);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&rnd.m_rnd.z)
  ;
  std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::~vector
            ((vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testComplementarity (Context& context, const int numClipDistances)
{
	// Check test requirements
	{
		const InstanceInterface&		vki			= context.getInstanceInterface();
		const VkPhysicalDevice			physDevice	= context.getPhysicalDevice();

		requireFeatures(vki, physDevice, FEATURE_SHADER_CLIP_DISTANCE);
	}

	std::vector<Shader> shaders;
	shaders.push_back(Shader(VK_SHADER_STAGE_VERTEX_BIT,	context.getBinaryCollection().get("vert")));
	shaders.push_back(Shader(VK_SHADER_STAGE_FRAGMENT_BIT,	context.getBinaryCollection().get("frag")));

	std::vector<Vec4> vertices;
	{
		de::Random	rnd						(1234);
		const int	numSections				= 16;
		const int	numVerticesPerSection	= 4;	// logical verticies, due to triangle list topology we actually use 6 per section

		DE_ASSERT(RENDER_SIZE_LARGE % numSections == 0);

		std::vector<float> clipDistances(numVerticesPerSection * numSections);
		for (int i = 0; i < static_cast<int>(clipDistances.size()); ++i)
			clipDistances[i] = rnd.getFloat(-1.0f, 1.0f);

		// Two sets of identical primitives, but with a different ClipDistance sign.
		for (int setNdx = 0; setNdx < 2; ++setNdx)
		{
			const float sign = (setNdx == 0 ? 1.0f : -1.0f);
			const float	dx	 = 2.0f / static_cast<float>(numSections);

			for (int i = 0; i < numSections; ++i)
			{
				const int	ndxBase	= numVerticesPerSection * i;
				const float x		= -1.0f + dx * static_cast<float>(i);
				const Vec4	p0		= Vec4(x,      -1.0f, 0.0f, sign * clipDistances[ndxBase + 0]);
				const Vec4	p1		= Vec4(x,       1.0f, 0.0f, sign * clipDistances[ndxBase + 1]);
				const Vec4	p2		= Vec4(x + dx,  1.0f, 0.0f, sign * clipDistances[ndxBase + 2]);
				const Vec4	p3		= Vec4(x + dx, -1.0f, 0.0f, sign * clipDistances[ndxBase + 3]);

				vertices.push_back(p0);
				vertices.push_back(p1);
				vertices.push_back(p2);

				vertices.push_back(p2);
				vertices.push_back(p3);
				vertices.push_back(p0);
			}
		}
	}

	tcu::TestLog& log = context.getTestContext().getLog();

	log << tcu::TestLog::Message << "Draw two sets of primitives with blending, differing only with ClipDistance sign." << tcu::TestLog::EndMessage
		<< tcu::TestLog::Message << "Using " << numClipDistances << " clipping plane(s), one of them possibly having negative values." << tcu::TestLog::EndMessage
		<< tcu::TestLog::Message << "Expecting a uniform gray area, no missing (black) nor overlapped (white) pixels." << tcu::TestLog::EndMessage;

	DrawState					drawState		(VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, RENDER_SIZE_LARGE, RENDER_SIZE_LARGE);
	DrawCallData				drawCallData	(vertices);
	VulkanProgram				vulkanProgram	(shaders);
	drawState.blendEnable		= true;

	VulkanDrawContext			drawContext(context, drawState, drawCallData, vulkanProgram);
	drawContext.draw();

	const int numGrayPixels		= countPixels(drawContext.getColorPixels(), Vec4(0.5f, 0.5f, 0.5f, 1.0f), Vec4(0.02f, 0.02f, 0.02f, 0.0f));
	const int numExpectedPixels	= RENDER_SIZE_LARGE * RENDER_SIZE_LARGE;

	return (numGrayPixels == numExpectedPixels ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Rendered image(s) are incorrect"));
}